

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

void cram_free_container(cram_container *c)

{
  int local_18;
  uint local_14;
  int i;
  cram_DS_ID id;
  cram_container *c_local;
  
  if (c != (cram_container *)0x0) {
    if (c->refs_used != (int *)0x0) {
      free(c->refs_used);
    }
    if (c->landmark != (int32_t *)0x0) {
      free(c->landmark);
    }
    if (c->comp_hdr != (cram_block_compression_hdr *)0x0) {
      cram_free_compression_header(c->comp_hdr);
    }
    if (c->comp_hdr_block != (cram_block *)0x0) {
      cram_free_block(c->comp_hdr_block);
    }
    if (c->slices != (cram_slice **)0x0) {
      for (local_18 = 0; local_18 < c->max_slice; local_18 = local_18 + 1) {
        if (c->slices[local_18] != (cram_slice *)0x0) {
          cram_free_slice(c->slices[local_18]);
        }
      }
      free(c->slices);
    }
    for (local_14 = 0xb; local_14 < 0x27; local_14 = local_14 + 1) {
      if (c->stats[local_14] != (cram_stats *)0x0) {
        cram_stats_free(c->stats[local_14]);
      }
    }
    if (c->tags_used != (kh_s_i2i_t *)0x0) {
      kh_destroy_s_i2i(c->tags_used);
    }
    free(c);
  }
  return;
}

Assistant:

void cram_free_container(cram_container *c) {
    enum cram_DS_ID id;
    int i;

    if (!c)
	return;

    if (c->refs_used)
	free(c->refs_used);

    if (c->landmark)
	free(c->landmark);

    if (c->comp_hdr)
	cram_free_compression_header(c->comp_hdr);

    if (c->comp_hdr_block)
	cram_free_block(c->comp_hdr_block);

    if (c->slices) {
	for (i = 0; i < c->max_slice; i++)
	    if (c->slices[i])
		cram_free_slice(c->slices[i]);
	free(c->slices);
    }

    for (id = DS_RN; id < DS_TN; id++)
	if (c->stats[id]) cram_stats_free(c->stats[id]);

    //if (c->aux_B_stats) cram_stats_free(c->aux_B_stats);
    
    if (c->tags_used) kh_destroy(s_i2i, c->tags_used);

    free(c);
}